

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int Jx9DeleteConstant(jx9_vm *pVm,char *zName)

{
  sxu32 nKeyLen;
  sxi32 sVar1;
  undefined8 *puStack_20;
  int rc;
  jx9_constant *pCons;
  char *zName_local;
  jx9_vm *pVm_local;
  
  pCons = (jx9_constant *)zName;
  zName_local = (char *)pVm;
  nKeyLen = SyStrlen(zName);
  sVar1 = SyHashDeleteEntry(&pVm->hConstant,zName,nKeyLen,&stack0xffffffffffffffe0);
  if (sVar1 == 0) {
    SyMemBackendFree((SyMemBackend *)zName_local,(void *)*puStack_20);
    SyMemBackendPoolFree((SyMemBackend *)zName_local,puStack_20);
  }
  return sVar1;
}

Assistant:

JX9_PRIVATE int Jx9DeleteConstant(jx9_vm *pVm,const char *zName)
{
	jx9_constant *pCons;
	int rc;
	/* Query the constant hashtable */
	 rc = SyHashDeleteEntry(&pVm->hConstant, (const void *)zName, SyStrlen(zName), (void **)&pCons);
	 if( rc == JX9_OK ){
		 /* Perform the deletion */
		 SyMemBackendFree(&pVm->sAllocator, (void *)SyStringData(&pCons->sName));
		 SyMemBackendPoolFree(&pVm->sAllocator, pCons);
	 }
	 return rc;
}